

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

FloorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_floor(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x29e) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x29e;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.floor_ = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::FloorLayerParams>(arena);
    (this->layer_).floor_ = (FloorLayerParams *)LVar2;
  }
  return (FloorLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::FloorLayerParams* NeuralNetworkLayer::_internal_mutable_floor() {
  if (!_internal_has_floor()) {
    clear_layer();
    set_has_floor();
    layer_.floor_ = CreateMaybeMessage< ::CoreML::Specification::FloorLayerParams >(GetArenaForAllocation());
  }
  return layer_.floor_;
}